

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O3

bool __thiscall cmCTestHG::IdentifyParser::ProcessLine(IdentifyParser *this)

{
  char *pcVar1;
  bool bVar2;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexIdentify,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexIdentify).regmatch);
  if (bVar2) {
    pcVar1 = (this->RegexIdentify).regmatch.startp[1];
    if (pcVar1 == (char *)0x0) {
      local_30 = &local_20;
      local_28 = 0;
      local_20 = 0;
    }
    else {
      local_30 = &local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,pcVar1,(this->RegexIdentify).regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)this->Rev,(string *)&local_30);
    if (local_30 != &local_20) {
      operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
    }
  }
  return !bVar2;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexIdentify.find(this->Line)) {
      this->Rev = this->RegexIdentify.match(1);
      return false;
    }
    return true;
  }